

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall common_log::resume(common_log *this)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  thread *in_stack_fffffffffffffff0;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffb8);
  if (((ulong)in_RDI[0xd]._M_device & 0x10000) == 0) {
    *(undefined1 *)((long)&in_RDI[0xd]._M_device + 2) = 1;
    std::thread::thread<common_log::resume()::_lambda()_1_,,void>
              (in_stack_fffffffffffffff0,
               (type *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    std::thread::operator=((thread *)in_RDI,(thread *)in_stack_ffffffffffffffb8);
    std::thread::~thread((thread *)0x35c8fe);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x35c910);
  return;
}

Assistant:

void resume() {
        std::lock_guard<std::mutex> lock(mtx);

        if (running) {
            return;
        }

        running = true;

        thrd = std::thread([this]() {
            while (true) {
                {
                    std::unique_lock<std::mutex> lock(mtx);
                    cv.wait(lock, [this]() { return head != tail; });

                    cur = entries[head];

                    head = (head + 1) % entries.size();
                }

                if (cur.is_end) {
                    break;
                }

                cur.print(); // stdout and stderr

                if (file) {
                    cur.print(file);
                }
            }
        });
    }